

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O2

int safe_pcre2_match_16(pcre2_code_16 *code,PCRE2_SPTR16 subject,qsizetype length,
                       qsizetype startOffset,int options,pcre2_match_data_16 *matchData,
                       pcre2_match_context_16 *matchContext)

{
  long lVar1;
  int iVar2;
  long *plVar3;
  long lVar4;
  
  iVar2 = pcre2_match_16();
  if (iVar2 == -0x2e) {
    plVar3 = (long *)_ZTWN12_GLOBAL__N_19jitStacksE();
    if (*plVar3 == 0) {
      plVar3 = (long *)_ZTWN12_GLOBAL__N_19jitStacksE();
      lVar4 = pcre2_jit_stack_create_16(0x8000,0x80000,0);
      lVar1 = *plVar3;
      *plVar3 = lVar4;
      if (lVar1 != 0) {
        pcre2_jit_stack_free_16();
      }
      iVar2 = pcre2_match_16(code,subject,length,startOffset,options,matchData);
      return iVar2;
    }
    iVar2 = -0x2e;
  }
  return iVar2;
}

Assistant:

static int safe_pcre2_match_16(const pcre2_code_16 *code,
                               PCRE2_SPTR16 subject, qsizetype length,
                               qsizetype startOffset, int options,
                               pcre2_match_data_16 *matchData,
                               pcre2_match_context_16 *matchContext)
{
    int result = pcre2_match_16(code, subject, length,
                                startOffset, options, matchData, matchContext);

    if (result == PCRE2_ERROR_JIT_STACKLIMIT && !jitStacks) {
        // The default JIT stack size in PCRE is 32K,
        // we allocate from 32K up to 512K.
        jitStacks.reset(pcre2_jit_stack_create_16(32 * 1024, 512 * 1024, NULL));

        result = pcre2_match_16(code, subject, length,
                                startOffset, options, matchData, matchContext);
    }

    return result;
}